

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

void __thiscall
TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test::
TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test
          (TEST_JUnitOutputTest_testFailureWithLessThanAndGreaterThanInsideIt_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).result = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).testCaseRunner =
       (JUnitTestOutputTestRunner *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).junitOutput = (JUnitTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).outputFile = (FileForJUnitOutputTests *)0x0;
  TEST_GROUP_CppUTestGroupJUnitOutputTest::TEST_GROUP_CppUTestGroupJUnitOutputTest
            (&this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest);
  (this->super_TEST_GROUP_CppUTestGroupJUnitOutputTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0034d2d0;
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithLessThanAndGreaterThanInsideIt)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test <failed>", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"thisfile:10: Test &lt;failed&gt;\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}